

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int str_format(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  size_t l_00;
  char *pcVar3;
  lua_Number lVar4;
  char *s;
  size_t l;
  char buff [512];
  char form [18];
  luaL_Buffer b;
  char *strfrmt_end;
  char *strfrmt;
  size_t sfl;
  int arg;
  int top;
  lua_State *L_local;
  
  _arg = L;
  sfl._4_4_ = lua_gettop(L);
  sfl._0_4_ = 1;
  strfrmt_end = luaL_checklstring(_arg,1,(size_t *)&strfrmt);
  b.buffer._8184_8_ = strfrmt_end + (long)strfrmt;
  luaL_buffinit(_arg,(luaL_Buffer *)(form + 0x10));
LAB_0011b782:
  while( true ) {
    while( true ) {
      if ((ulong)b.buffer._8184_8_ <= strfrmt_end) {
        luaL_pushresult((luaL_Buffer *)(form + 0x10));
        return 1;
      }
      if (*strfrmt_end == '%') break;
      if (b.buffer + 0x1ff8 <= stack0xffffffffffffdfb0) {
        luaL_prepbuffer((luaL_Buffer *)(form + 0x10));
      }
      *stack0xffffffffffffdfb0 = *strfrmt_end;
      unique0x100003c0 = stack0xffffffffffffdfb0 + 1;
      strfrmt_end = strfrmt_end + 1;
    }
    pcVar3 = strfrmt_end + 1;
    if (strfrmt_end[1] != '%') break;
    if (b.buffer + 0x1ff8 <= stack0xffffffffffffdfb0) {
      luaL_prepbuffer((luaL_Buffer *)(form + 0x10));
    }
    strfrmt_end = strfrmt_end + 2;
    *stack0xffffffffffffdfb0 = *pcVar3;
    unique0x100003c8 = stack0xffffffffffffdfb0 + 1;
  }
  sfl._0_4_ = (int)sfl + 1;
  if (sfl._4_4_ < (int)sfl) {
    luaL_argerror(_arg,(int)sfl,"no value");
  }
  pcVar3 = scanformat(_arg,pcVar3,buff + 0x1f8);
  strfrmt_end = pcVar3 + 1;
  switch(*pcVar3) {
  case 'E':
  case 'G':
  case 'e':
  case 'f':
  case 'g':
    luaL_checknumber(_arg,(int)sfl);
    sprintf((char *)&l,buff + 0x1f8);
    break;
  default:
    iVar1 = luaL_error(_arg,"invalid option \'%%%c\' to \'format\'",(ulong)(uint)(int)*pcVar3);
    return iVar1;
  case 'X':
  case 'o':
  case 'u':
  case 'x':
    addintlen(buff + 0x1f8);
    lVar4 = luaL_checknumber(_arg,(int)sfl);
    sprintf((char *)&l,buff + 0x1f8,
            (long)lVar4 | (long)(lVar4 - 9.223372036854776e+18) & (long)lVar4 >> 0x3f);
    break;
  case 'c':
    lVar4 = luaL_checknumber(_arg,(int)sfl);
    sprintf((char *)&l,buff + 0x1f8,(ulong)(uint)(int)lVar4);
    break;
  case 'd':
  case 'i':
    addintlen(buff + 0x1f8);
    lVar4 = luaL_checknumber(_arg,(int)sfl);
    sprintf((char *)&l,buff + 0x1f8,(long)lVar4);
    break;
  case 'q':
    addquoted(_arg,(luaL_Buffer *)(form + 0x10),(int)sfl);
    goto LAB_0011b782;
  case 's':
    pcVar3 = luaL_checklstring(_arg,(int)sfl,(size_t *)&s);
    pcVar2 = strchr(buff + 0x1f8,0x2e);
    if ((pcVar2 != (char *)0x0) || (s < (char *)0x64)) {
      sprintf((char *)&l,buff + 0x1f8,pcVar3);
      break;
    }
    lua_pushvalue(_arg,(int)sfl);
    luaL_addvalue((luaL_Buffer *)(form + 0x10));
    goto LAB_0011b782;
  }
  l_00 = strlen((char *)&l);
  luaL_addlstring((luaL_Buffer *)(form + 0x10),(char *)&l,l_00);
  goto LAB_0011b782;
}

Assistant:

static int str_format(lua_State*L){
int top=lua_gettop(L);
int arg=1;
size_t sfl;
const char*strfrmt=luaL_checklstring(L,arg,&sfl);
const char*strfrmt_end=strfrmt+sfl;
luaL_Buffer b;
luaL_buffinit(L,&b);
while(strfrmt<strfrmt_end){
if(*strfrmt!='%')
luaL_addchar(&b,*strfrmt++);
else if(*++strfrmt=='%')
luaL_addchar(&b,*strfrmt++);
else{
char form[(sizeof("-+ #0")+sizeof("l")+10)];
char buff[512];
if(++arg>top)
luaL_argerror(L,arg,"no value");
strfrmt=scanformat(L,strfrmt,form);
switch(*strfrmt++){
case'c':{
sprintf(buff,form,(int)luaL_checknumber(L,arg));
break;
}
case'd':case'i':{
addintlen(form);
sprintf(buff,form,(long)luaL_checknumber(L,arg));
break;
}
case'o':case'u':case'x':case'X':{
addintlen(form);
sprintf(buff,form,(unsigned long)luaL_checknumber(L,arg));
break;
}
case'e':case'E':case'f':
case'g':case'G':{
sprintf(buff,form,(double)luaL_checknumber(L,arg));
break;
}
case'q':{
addquoted(L,&b,arg);
continue;
}
case's':{
size_t l;
const char*s=luaL_checklstring(L,arg,&l);
if(!strchr(form,'.')&&l>=100){
lua_pushvalue(L,arg);
luaL_addvalue(&b);
continue;
}
else{
sprintf(buff,form,s);
break;
}
}
default:{
return luaL_error(L,"invalid option "LUA_QL("%%%c")" to "
LUA_QL("format"),*(strfrmt-1));
}
}
luaL_addlstring(&b,buff,strlen(buff));
}
}
luaL_pushresult(&b);
return 1;
}